

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O1

void __thiscall
HighsLinearSumBounds::add(HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  double *pdVar1;
  int *piVar2;
  pointer pHVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (this->implVarLowerSource[var] == sum) {
    pdVar4 = this->varLower + var;
  }
  else {
    pdVar4 = this->implVarLower + var;
    dVar7 = this->varLower[var];
    if (*pdVar4 <= dVar7 && dVar7 != *pdVar4) {
      pdVar4 = this->varLower + var;
    }
  }
  if (this->implVarUpperSource[var] == sum) {
    pdVar5 = this->varUpper + var;
  }
  else {
    pdVar1 = this->varUpper + var;
    dVar7 = this->implVarUpper[var];
    pdVar5 = this->implVarUpper + var;
    if (*pdVar1 <= dVar7 && dVar7 != *pdVar1) {
      pdVar5 = pdVar1;
    }
  }
  dVar7 = *pdVar4;
  dVar6 = *pdVar5;
  if (coefficient <= 0.0) {
    if (dVar6 < INFINITY) {
      dVar6 = dVar6 * coefficient;
      pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar8 = pHVar3[sum].hi;
      dVar9 = dVar6 + dVar8;
      pHVar3[sum].hi = dVar9;
      pHVar3[sum].lo =
           (dVar8 - (dVar9 - dVar6)) + (dVar6 - (dVar9 - (dVar9 - dVar6))) + pHVar3[sum].lo;
    }
    else {
      piVar2 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + 1;
    }
    if (-INFINITY < dVar7) {
      dVar7 = dVar7 * coefficient;
      pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar6 = pHVar3[sum].hi;
      dVar8 = dVar7 + dVar6;
      pHVar3[sum].hi = dVar8;
      pHVar3[sum].lo =
           (dVar6 - (dVar8 - dVar7)) + (dVar7 - (dVar8 - (dVar8 - dVar7))) + pHVar3[sum].lo;
    }
    else {
      piVar2 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + 1;
    }
    if (this->varUpper[var] < INFINITY) {
      dVar6 = this->varUpper[var] * coefficient;
      pHVar3 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar3[sum].hi;
      dVar8 = dVar6 + dVar7;
      pHVar3[sum].hi = dVar8;
      pHVar3[sum].lo =
           (dVar7 - (dVar8 - dVar6)) + (dVar6 - (dVar8 - (dVar8 - dVar6))) + pHVar3[sum].lo;
    }
    else {
      piVar2 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + 1;
    }
    dVar7 = this->varLower[var];
    if (-INFINITY < dVar7) goto LAB_0037d1bd;
  }
  else {
    if (-INFINITY < dVar7) {
      dVar7 = dVar7 * coefficient;
      pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar8 = pHVar3[sum].hi;
      dVar9 = dVar7 + dVar8;
      pHVar3[sum].hi = dVar9;
      pHVar3[sum].lo =
           (dVar8 - (dVar9 - dVar7)) + (dVar7 - (dVar9 - (dVar9 - dVar7))) + pHVar3[sum].lo;
    }
    else {
      piVar2 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + 1;
    }
    if (dVar6 < INFINITY) {
      dVar6 = dVar6 * coefficient;
      pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar3[sum].hi;
      dVar8 = dVar6 + dVar7;
      pHVar3[sum].hi = dVar8;
      pHVar3[sum].lo =
           (dVar7 - (dVar8 - dVar6)) + (dVar6 - (dVar8 - (dVar8 - dVar6))) + pHVar3[sum].lo;
    }
    else {
      piVar2 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + 1;
    }
    if (-INFINITY < this->varLower[var]) {
      dVar6 = this->varLower[var] * coefficient;
      pHVar3 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar3[sum].hi;
      dVar8 = dVar6 + dVar7;
      pHVar3[sum].hi = dVar8;
      pHVar3[sum].lo =
           (dVar7 - (dVar8 - dVar6)) + (dVar6 - (dVar8 - (dVar8 - dVar6))) + pHVar3[sum].lo;
    }
    else {
      piVar2 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar2 = *piVar2 + 1;
    }
    dVar7 = this->varUpper[var];
    if (dVar7 < INFINITY) {
LAB_0037d1bd:
      dVar7 = dVar7 * coefficient;
      pHVar3 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar6 = pHVar3[sum].hi;
      dVar8 = dVar7 + dVar6;
      pHVar3[sum].hi = dVar8;
      pHVar3[sum].lo =
           (dVar6 - (dVar8 - dVar7)) + (dVar7 - (dVar8 - (dVar8 - dVar7))) + pHVar3[sum].lo;
      return;
    }
  }
  piVar2 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + sum;
  *piVar2 = *piVar2 + 1;
  return;
}

Assistant:

void HighsLinearSumBounds::add(HighsInt sum, HighsInt var, double coefficient) {
  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);
  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    // coefficient is positive, therefore variable lower contributes to sum
    // lower bound
    if (vLower == -kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vLower * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vUpper * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varLower[var] * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varUpper[var] * coefficient;
  } else {
    // coefficient is negative, therefore variable upper contributes to sum
    // lower bound
    if (vUpper == kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vUpper * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vLower * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varUpper[var] * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varLower[var] * coefficient;
  }
}